

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

void Jupiter::reinitialize_plugins(void)

{
  bool bVar1;
  size_type sVar2;
  
  while( true ) {
    bVar1 = std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>::empty(plugins);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    sVar2 = std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>::size(plugins);
    Jupiter::Plugin::free(sVar2 - 1);
  }
  initialize_plugins();
  return;
}

Assistant:

void reinitialize_plugins() {
	// Uninitialize back -> front
	while (!Jupiter::plugins.empty()) {
		Jupiter::Plugin::free(Jupiter::plugins.size() - 1);
	}

	initialize_plugins();
}